

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O1

void __thiscall HEkkPrimal::adjustPerturbedEquationOut(HEkkPrimal *this)

{
  int iVar1;
  HEkk *pHVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  pHVar2 = this->ekk_instance_;
  if ((pHVar2->info_).bounds_perturbed == true) {
    iVar1 = this->variable_out;
    if (iVar1 < this->num_col) {
      dVar4 = (pHVar2->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar1];
      dVar5 = (pHVar2->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar1];
    }
    else {
      iVar3 = iVar1 - this->num_col;
      dVar4 = -(pHVar2->lp_).row_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar3];
      dVar5 = -(pHVar2->lp_).row_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar3];
    }
    if (dVar5 <= dVar4) {
      this->theta_primal =
           ((pHVar2->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[this->row_out] - dVar4) / this->alpha_col;
      (pHVar2->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar1] = dVar4;
      (pHVar2->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar1] = dVar4;
      (pHVar2->info_).workRange_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar1] = 0.0;
      this->value_in =
           (pHVar2->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[this->variable_in] + this->theta_primal;
    }
  }
  return;
}

Assistant:

void HEkkPrimal::adjustPerturbedEquationOut() {
  if (!ekk_instance_.info_.bounds_perturbed) return;
  const HighsLp& lp = ekk_instance_.lp_;
  HighsSimplexInfo& info = ekk_instance_.info_;
  double lp_lower;
  double lp_upper;
  if (variable_out < num_col) {
    lp_lower = lp.col_lower_[variable_out];
    lp_upper = lp.col_upper_[variable_out];
  } else {
    lp_lower = -lp.row_upper_[variable_out - num_col];
    lp_upper = -lp.row_lower_[variable_out - num_col];
  }
  if (lp_lower < lp_upper) return;
  // Leaving variable is fixed
  //  double save_theta_primal = theta_primal;
  double true_fixed_value = lp_lower;
  // Modify theta_primal so that variable leaves at true fixed value
  theta_primal = (info.baseValue_[row_out] - true_fixed_value) / alpha_col;
  /*
    printf("For equation %4" HIGHSINT_FORMAT " to be nonbasic at RHS %10.4g
    requires theta_primal to change by %10.4g from %10.4g to %10.4g\n",
    variable_out, true_fixed_value, theta_primal-save_theta_primal,
    save_theta_primal, theta_primal);
  */
  info.workLower_[variable_out] = true_fixed_value;
  info.workUpper_[variable_out] = true_fixed_value;
  info.workRange_[variable_out] = 0;
  value_in = info.workValue_[variable_in] + theta_primal;
}